

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  reference pvVar4;
  Allocator *_allocator;
  reference pvVar5;
  reference ppLVar6;
  long *in_RSI;
  long in_RDI;
  int lr;
  int j_4;
  int j_3;
  int dims;
  Blob *blob_2;
  int j_2;
  int *psh;
  Mat shape_hints;
  int pdlr;
  Blob *blob_1;
  int top_blob_index;
  int j_1;
  Blob *blob;
  int bottom_blob_index;
  int j;
  int custom_index;
  Layer *layer;
  int top_count;
  int bottom_count;
  int typeindex;
  int i;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  Mat *in_stack_fffffffffffff470;
  Layer *in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff480;
  int in_stack_fffffffffffff484;
  Net *in_stack_fffffffffffff488;
  Net *in_stack_fffffffffffff490;
  ParamDict *in_stack_fffffffffffff498;
  Mat *in_stack_fffffffffffff4a0;
  ParamDict *in_stack_fffffffffffff4b0;
  int local_ae8;
  int local_ae4;
  Mat local_aa0;
  Mat local_a60;
  int local_a1c;
  reference local_a18;
  int local_a0c;
  int *local_a08;
  Mat local_a00;
  Mat local_9c0;
  int local_97c;
  reference local_978;
  int local_970;
  int local_96c;
  reference local_968;
  int local_95c;
  int local_958;
  uint local_954;
  Layer *local_950;
  undefined4 local_948;
  int local_938;
  int local_934;
  uint local_930;
  int local_92c;
  undefined1 local_928 [2308];
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  int local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  lVar3 = (**(code **)(*in_RSI + 0x18))(in_RSI,&local_1c,4);
  if (lVar3 == 4) {
    if (local_1c == 0x7685dd) {
      local_20 = 0;
      local_24 = 0;
      lVar3 = (**(code **)(*local_18 + 0x18))(local_18,&local_20,4);
      if (lVar3 == 4) {
        lVar3 = (**(code **)(*local_18 + 0x18))(local_18,&local_24,4);
        if (lVar3 == 4) {
          if ((local_20 < 1) || (local_24 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count\n");
            local_4 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       in_stack_fffffffffffff490,(size_type)in_stack_fffffffffffff488);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_stack_fffffffffffff490,
                       (size_type)in_stack_fffffffffffff488);
            ParamDict::ParamDict(in_stack_fffffffffffff4b0);
            for (local_92c = 0; local_92c < local_20; local_92c = local_92c + 1) {
              lVar3 = (**(code **)(*local_18 + 0x18))(local_18,&local_930,4);
              if (lVar3 != 4) {
                fprintf(_stderr,"read typeindex failed\n");
                local_4 = -1;
                goto LAB_00131e6d;
              }
              lVar3 = (**(code **)(*local_18 + 0x18))(local_18,&local_934,4);
              if (lVar3 != 4) {
                fprintf(_stderr,"read bottom_count failed\n");
                local_4 = -1;
                goto LAB_00131e6d;
              }
              lVar3 = (**(code **)(*local_18 + 0x18))(local_18,&local_938,4);
              if (lVar3 != 4) {
                fprintf(_stderr,"read top_count failed\n");
                local_4 = -1;
                goto LAB_00131e6d;
              }
              local_950 = create_layer((int)((ulong)in_stack_fffffffffffff478 >> 0x20));
              if (local_950 == (Layer *)0x0) {
                local_954 = local_930 & 0xfffffeff;
                local_950 = create_custom_layer(in_stack_fffffffffffff488,in_stack_fffffffffffff484)
                ;
              }
              if (local_950 == (Layer *)0x0) {
                fprintf(_stderr,"layer %d not exists or registered\n",(ulong)local_930);
                clear(in_stack_fffffffffffff490);
                local_4 = -1;
                goto LAB_00131e6d;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff490,
                         (size_type)in_stack_fffffffffffff488);
              for (local_958 = 0; local_958 < local_934; local_958 = local_958 + 1) {
                lVar3 = (**(code **)(*local_18 + 0x18))(local_18,&local_95c,4);
                if (lVar3 != 4) {
                  fprintf(_stderr,"read bottom_blob_index failed\n");
                  local_4 = -1;
                  goto LAB_00131e6d;
                }
                local_968 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI + 0x28),(long)local_95c);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                           (value_type_conflict *)in_stack_fffffffffffff478);
                iVar1 = local_95c;
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_950->bottoms,(long)local_958);
                *pvVar4 = iVar1;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff490,
                         (size_type)in_stack_fffffffffffff488);
              for (local_96c = 0; local_96c < local_938; local_96c = local_96c + 1) {
                lVar3 = (**(code **)(*local_18 + 0x18))(local_18,&local_970,4);
                if (lVar3 != 4) {
                  fprintf(_stderr,"read top_blob_index failed\n");
                  local_4 = -1;
                  goto LAB_00131e6d;
                }
                local_978 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI + 0x28),(long)local_970);
                iVar1 = local_970;
                local_978->producer = local_92c;
                pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_950->tops,(long)local_96c);
                *pvVar4 = iVar1;
              }
              local_97c = ParamDict::load_param_bin
                                    (in_stack_fffffffffffff498,
                                     (DataReader *)in_stack_fffffffffffff490);
              if (local_97c == 0) {
                Mat::Mat(&local_a00);
                ParamDict::get(in_stack_fffffffffffff498,
                               (int)((ulong)in_stack_fffffffffffff490 >> 0x20),
                               (Mat *)in_stack_fffffffffffff488);
                Mat::~Mat((Mat *)0x13192c);
                bVar2 = Mat::empty(in_stack_fffffffffffff470);
                if (!bVar2) {
                  local_a08 = Mat::operator_cast_to_int_(&local_9c0);
                  for (local_a0c = 0; local_a0c < local_938; local_a0c = local_a0c + 1) {
                    _allocator = (Allocator *)(in_RDI + 0x28);
                    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&local_950->tops,(long)local_a0c);
                    local_a18 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                          ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                           _allocator,(long)*pvVar4);
                    local_a1c = *local_a08;
                    if (local_a1c == 1) {
                      Mat::Mat(&local_a60,local_a08[1],(void *)0x0,4,1,(Allocator *)0x0);
                      Mat::operator=((Mat *)in_stack_fffffffffffff478,in_stack_fffffffffffff470);
                      Mat::~Mat((Mat *)0x131a40);
                    }
                    if (local_a1c == 2) {
                      Mat::Mat(&local_aa0,local_a08[1],local_a08[2],(void *)0x0,4,1,(Allocator *)0x0
                              );
                      Mat::operator=((Mat *)in_stack_fffffffffffff478,in_stack_fffffffffffff470);
                      Mat::~Mat((Mat *)0x131b14);
                    }
                    if (local_a1c == 3) {
                      in_stack_fffffffffffff470 = (Mat *)0x0;
                      Mat::Mat((Mat *)in_stack_fffffffffffff490,
                               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),
                               (int)in_stack_fffffffffffff488,in_stack_fffffffffffff484,
                               in_stack_fffffffffffff478,0,(int)in_stack_fffffffffffff4a0,_allocator
                              );
                      Mat::operator=((Mat *)in_stack_fffffffffffff478,in_stack_fffffffffffff470);
                      Mat::~Mat((Mat *)0x131bae);
                    }
                    local_a08 = local_a08 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffff490,(size_type)in_stack_fffffffffffff488);
                for (local_ae4 = 0; local_ae4 < local_934; local_ae4 = local_ae4 + 1) {
                  in_stack_fffffffffffff498 = (ParamDict *)(in_RDI + 0x28);
                  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_950->bottoms,(long)local_ae4);
                  pvVar5 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_fffffffffffff498,(long)*pvVar4);
                  in_stack_fffffffffffff4a0 = &pvVar5->shape;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (&local_950->bottom_shapes,(long)local_ae4);
                  Mat::operator=((Mat *)in_stack_fffffffffffff478,in_stack_fffffffffffff470);
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffff490,(size_type)in_stack_fffffffffffff488);
                for (local_ae8 = 0; local_ae8 < local_938; local_ae8 = local_ae8 + 1) {
                  in_stack_fffffffffffff488 = (Net *)(in_RDI + 0x28);
                  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_950->tops,(long)local_ae8);
                  pvVar5 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_fffffffffffff488,(long)*pvVar4);
                  in_stack_fffffffffffff490 = (Net *)&pvVar5->shape;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (&local_950->top_shapes,(long)local_ae8);
                  Mat::operator=((Mat *)in_stack_fffffffffffff478,in_stack_fffffffffffff470);
                }
                in_stack_fffffffffffff484 = (*local_950->_vptr_Layer[2])(local_950,local_928);
                if (in_stack_fffffffffffff484 == 0) {
                  in_stack_fffffffffffff478 = local_950;
                  ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                       (in_RDI + 0x40),(long)local_92c);
                  *ppLVar6 = in_stack_fffffffffffff478;
                  local_948 = 0;
                }
                else {
                  fprintf(_stderr,"layer load_param failed\n");
                  local_948 = 4;
                }
                Mat::~Mat((Mat *)0x131e21);
              }
              else {
                fprintf(_stderr,"ParamDict load_param failed\n");
              }
            }
            local_4 = 0;
LAB_00131e6d:
            local_948 = 1;
            ParamDict::~ParamDict
                      ((ParamDict *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
          }
        }
        else {
          fprintf(_stderr,"read blob_count failed\n");
          local_4 = -1;
        }
      }
      else {
        fprintf(_stderr,"read layer_count failed\n");
        local_4 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate\n");
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"read magic failed\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        fprintf(stderr, "read " #buf " failed\n"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}